

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintDescriptor
          (Generator *this,Descriptor *message_descriptor)

{
  Printer *pPVar1;
  Generator *pGVar2;
  Generator *this_00;
  mapped_type *pmVar3;
  long lVar4;
  int i_00;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  int i_1;
  char *pcVar6;
  char *pcVar7;
  int i;
  long lVar8;
  byte bVar9;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  Generator *local_1d0;
  DescriptorProto edp;
  string local_128;
  string options_string;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  string local_b8;
  char required_function_arguments [91];
  
  bVar9 = 0;
  PrintNestedDescriptors(this,message_descriptor);
  io::Printer::Print(this->printer_,"\n");
  pPVar1 = this->printer_;
  ModuleLevelDescriptorName<google::protobuf::Descriptor>((string *)&edp,this,message_descriptor);
  io::Printer::Print(pPVar1,"$descriptor_name$ = _descriptor.Descriptor(\n","descriptor_name",
                     (string *)&edp);
  std::__cxx11::string::~string((string *)&edp);
  io::Printer::Indent(this->printer_);
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &m._M_t._M_impl.super__Rb_tree_header._M_header;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&edp,"name",(allocator<char> *)required_function_arguments);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  std::__cxx11::string::~string((string *)&edp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&edp,"full_name",(allocator<char> *)required_function_arguments);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  std::__cxx11::string::~string((string *)&edp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&edp,"file",(allocator<char> *)required_function_arguments);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&edp);
  pcVar6 = 
  "name=\'$name$\',\nfull_name=\'$full_name$\',\nfilename=None,\nfile=$file$,\ncontaining_type=None,\n"
  ;
  pcVar7 = required_function_arguments;
  for (lVar4 = 0x5b; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pcVar7 = *pcVar6;
    pcVar6 = pcVar6 + (ulong)bVar9 * -2 + 1;
    pcVar7 = pcVar7 + (ulong)bVar9 * -2 + 1;
  }
  io::Printer::Print(this->printer_,&m,required_function_arguments);
  PrintFieldsInDescriptor(this,message_descriptor);
  PrintExtensionsInDescriptor(this,message_descriptor);
  io::Printer::Print(this->printer_,"nested_types=[");
  lVar4 = 0;
  local_1d0 = this;
  for (lVar8 = 0; pGVar2 = local_1d0, lVar8 < *(int *)(message_descriptor + 0x38); lVar8 = lVar8 + 1
      ) {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              ((string *)&edp,this,(Descriptor *)(*(long *)(message_descriptor + 0x40) + lVar4));
    io::Printer::Print(this->printer_,"$name$, ","name",(string *)&edp);
    std::__cxx11::string::~string((string *)&edp);
    lVar4 = lVar4 + 0x78;
  }
  io::Printer::Print(local_1d0->printer_,"],\n");
  io::Printer::Print(pGVar2->printer_,"enum_types=[\n");
  io::Printer::Indent(pGVar2->printer_);
  pGVar2 = local_1d0;
  lVar8 = 0;
  for (lVar4 = 0; this_00 = local_1d0, lVar4 < *(int *)(message_descriptor + 0x48);
      lVar4 = lVar4 + 1) {
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
              ((string *)&edp,pGVar2,
               (EnumDescriptor *)(*(long *)(message_descriptor + 0x50) + lVar8));
    io::Printer::Print(pGVar2->printer_,
                       (char *)edp.super_Message.super_MessageLite._vptr_MessageLite);
    io::Printer::Print(pGVar2->printer_,",\n");
    std::__cxx11::string::~string((string *)&edp);
    lVar8 = lVar8 + 0x38;
  }
  io::Printer::Outdent(local_1d0->printer_);
  io::Printer::Print(this_00->printer_,"],\n");
  options_string._M_dataplus._M_p = (pointer)&options_string.field_2;
  options_string._M_string_length = 0;
  options_string.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString(*(MessageLite **)(message_descriptor + 0x20),&options_string);
  pPVar1 = this_00->printer_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"MessageOptions",&local_1d1);
  OptionsValue((string *)&edp,this_00,&local_128,&options_string);
  pcVar6 = "False";
  if (0 < *(int *)(message_descriptor + 0x58)) {
    pcVar6 = "True";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar6,&local_1d2);
  io::Printer::Print(pPVar1,"options=$options_value$,\nis_extendable=$extendable$","options_value",
                     (string *)&edp,"extendable",&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&edp);
  std::__cxx11::string::~string((string *)&local_128);
  io::Printer::Print(this_00->printer_,",\n");
  io::Printer::Print(this_00->printer_,"extension_ranges=[");
  uVar5 = extraout_RDX;
  for (lVar4 = 0; pGVar2 = local_1d0, lVar4 < *(int *)(message_descriptor + 0x58); lVar4 = lVar4 + 1
      ) {
    lVar8 = *(long *)(message_descriptor + 0x60);
    pPVar1 = local_1d0->printer_;
    SimpleItoa_abi_cxx11_((string *)&edp,(protobuf *)(ulong)*(uint *)(lVar8 + lVar4 * 8),(int)uVar5)
    ;
    SimpleItoa_abi_cxx11_(&local_128,(protobuf *)(ulong)*(uint *)(lVar8 + 4 + lVar4 * 8),i_00);
    io::Printer::Print(pPVar1,"($start$, $end$), ","start",(string *)&edp,"end",&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&edp);
    uVar5 = extraout_RDX_00;
  }
  io::Printer::Print(local_1d0->printer_,"],\n");
  DescriptorProto::DescriptorProto(&edp);
  PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
            (pGVar2,message_descriptor,&edp);
  io::Printer::Outdent(pGVar2->printer_);
  io::Printer::Print(pGVar2->printer_,")\n");
  DescriptorProto::~DescriptorProto(&edp);
  std::__cxx11::string::~string((string *)&options_string);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&m._M_t);
  return;
}

Assistant:

void Generator::PrintDescriptor(const Descriptor& message_descriptor) const {
  PrintNestedDescriptors(message_descriptor);

  printer_->Print("\n");
  printer_->Print("$descriptor_name$ = _descriptor.Descriptor(\n",
                  "descriptor_name",
                  ModuleLevelDescriptorName(message_descriptor));
  printer_->Indent();
  map<string, string> m;
  m["name"] = message_descriptor.name();
  m["full_name"] = message_descriptor.full_name();
  m["file"] = kDescriptorKey;
  const char required_function_arguments[] =
      "name='$name$',\n"
      "full_name='$full_name$',\n"
      "filename=None,\n"
      "file=$file$,\n"
      "containing_type=None,\n";
  printer_->Print(m, required_function_arguments);
  PrintFieldsInDescriptor(message_descriptor);
  PrintExtensionsInDescriptor(message_descriptor);

  // Nested types
  printer_->Print("nested_types=[");
  for (int i = 0; i < message_descriptor.nested_type_count(); ++i) {
    const string nested_name = ModuleLevelDescriptorName(
        *message_descriptor.nested_type(i));
    printer_->Print("$name$, ", "name", nested_name);
  }
  printer_->Print("],\n");

  // Enum types
  printer_->Print("enum_types=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.enum_type_count(); ++i) {
    const string descriptor_name = ModuleLevelDescriptorName(
        *message_descriptor.enum_type(i));
    printer_->Print(descriptor_name.c_str());
    printer_->Print(",\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  string options_string;
  message_descriptor.options().SerializeToString(&options_string);
  printer_->Print(
      "options=$options_value$,\n"
      "is_extendable=$extendable$",
      "options_value", OptionsValue("MessageOptions", options_string),
      "extendable", message_descriptor.extension_range_count() > 0 ?
                      "True" : "False");
  printer_->Print(",\n");

  // Extension ranges
  printer_->Print("extension_ranges=[");
  for (int i = 0; i < message_descriptor.extension_range_count(); ++i) {
    const Descriptor::ExtensionRange* range =
        message_descriptor.extension_range(i);
    printer_->Print("($start$, $end$), ",
                    "start", SimpleItoa(range->start),
                    "end", SimpleItoa(range->end));
  }
  printer_->Print("],\n");

  // Serialization of proto
  DescriptorProto edp;
  PrintSerializedPbInterval(message_descriptor, edp);

  printer_->Outdent();
  printer_->Print(")\n");
}